

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbolic_invert.cc
# Opt level: O2

void ipx::SymbolicInvert(Model *model,vector<int,_std::allocator<int>_> *basis,Int *rowcounts,
                        Int *colcounts)

{
  uint uVar1;
  int iVar2;
  Int *pIVar3;
  Int *pIVar4;
  int *piVar5;
  pointer piVar6;
  result_type_conflict2 rVar7;
  uint uVar8;
  int iVar9;
  Int IVar10;
  int iVar11;
  pointer piVar12;
  int *piVar13;
  ulong uVar14;
  pointer piVar15;
  ulong uVar16;
  long lVar17;
  uint top;
  ulong uVar18;
  size_type sVar19;
  Int k;
  vector<int,_std::allocator<int>_> stack;
  allocator_type local_259;
  vector<int,_std::allocator<int>_> marked;
  vector<int,_std::allocator<int>_> work;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  blocks;
  value_type_conflict2 local_1f4;
  Int *local_1f0;
  Int *local_1e8;
  vector<int,_std::allocator<int>_> jmatch;
  vector<int,_std::allocator<int>_> work_1;
  SparseMatrix C;
  SparseMatrix BT;
  
  uVar1 = (model->AI_).nrow_;
  uVar18 = (ulong)((long)(basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish -
                  (long)(basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start) >> 2;
  BT.nrow_ = 1;
  BT._4_4_ = 0;
  iVar9 = (int)uVar18;
  C._4_4_ = iVar9 + -1;
  C.nrow_ = 0;
  local_1f0 = rowcounts;
  local_1e8 = colcounts;
  std::vector<int,_std::allocator<int>_>::vector(&work,basis);
  uVar14 = 0;
  uVar18 = uVar18 & 0xffffffff;
  if (iVar9 < 1) {
    uVar18 = uVar14;
  }
  for (; piVar12 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start, uVar18 != uVar14; uVar14 = uVar14 + 1) {
    rVar7 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&C,
                       (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&BT)
    ;
    iVar9 = piVar12[uVar14];
    piVar12[uVar14] =
         work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [rVar7];
    work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    [rVar7] = iVar9;
  }
  iVar9 = model->num_rows_;
  sVar19 = (size_type)iVar9;
  iVar11 = model->num_cols_;
  pIVar3 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  BT.nrow_ = -1;
  std::vector<int,_std::allocator<int>_>::vector(&jmatch,sVar19,&BT.nrow_,(allocator_type *)&C);
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)&BT,pIVar3,pIVar3 + (long)iVar11 + sVar19,
             (allocator_type *)&C);
  work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&C,(long)iVar11 + sVar19,
             (value_type_conflict2 *)&work_1,(allocator_type *)&stack);
  std::vector<int,_std::allocator<int>_>::vector(&work_1,sVar19,(allocator_type *)&stack);
  sVar19 = (size_type)(iVar9 + 1);
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar19,(allocator_type *)&marked);
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar19,(allocator_type *)&blocks);
  piVar12 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish;
  for (piVar15 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
      piVar13 = work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start, piVar15 != piVar12; piVar15 = piVar15 + 1) {
    iVar9 = *piVar15;
    if (pIVar3[(long)iVar9 + 1] == pIVar3[iVar9] + 1) {
      AugmentingPath(iVar9,pIVar3,pIVar4,
                     jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,(Int *)BT._0_8_,
                     (Int *)CONCAT44(C._4_4_,C.nrow_),
                     (Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
    }
  }
  for (; piVar13 !=
         work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish; piVar13 = piVar13 + 1) {
    iVar9 = *piVar13;
    if (pIVar3[(long)iVar9 + 1] != pIVar3[iVar9] + 1) {
      AugmentingPath(iVar9,pIVar3,pIVar4,
                     jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,(Int *)BT._0_8_,
                     (Int *)CONCAT44(C._4_4_,C.nrow_),
                     (Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_),
                     (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_));
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&marked.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&stack.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work_1.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&C);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&BT);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work.super__Vector_base<int,_std::allocator<int>_>);
  CopyColumns(&BT,&model->AI_,&jmatch);
  Transpose(&C,&BT);
  SparseMatrix::operator=(&BT,&C);
  SparseMatrix::~SparseMatrix(&C);
  piVar15 = BT.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
  piVar12 = BT.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start;
  top = (model->AI_).nrow_;
  pIVar3 = (model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar4 = (model->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar19 = (size_type)(int)top;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&C,sVar19,(allocator_type *)&work_1);
  std::vector<int,_std::allocator<int>_>::vector(&work_1,sVar19,(allocator_type *)&stack);
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar19,(allocator_type *)&marked);
  uVar18 = 0;
  uVar14 = 0;
  uVar8 = top;
  if (0 < (int)top) {
    uVar14 = (ulong)top;
  }
  for (; uVar14 != uVar18; uVar18 = uVar18 + 1) {
    if (((Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_))[uVar18] != 1) {
      uVar8 = DepthFirstSearch((Int)uVar18,pIVar3,pIVar4,
                               jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start,uVar8,
                               (Int *)CONCAT44(C._4_4_,C.nrow_),
                               (Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                                               work_1.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_),1,
                               (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                                               stack.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_));
    }
  }
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  blocks.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar19,(allocator_type *)&work);
  piVar6 = C.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (piVar13 = (int *)CONCAT44(C._4_4_,C.nrow_); piVar13 != piVar6; piVar13 = piVar13 + 1) {
    if (((Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,
                         work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_))[*piVar13] != 2) {
      uVar8 = DepthFirstSearch(*piVar13,piVar12,piVar15,(Int *)0x0,top,
                               (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                                               marked.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_),
                               (Int *)CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                                               work_1.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_),2,
                               (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._4_4_,
                                               stack.super__Vector_base<int,_std::allocator<int>_>.
                                               _M_impl.super__Vector_impl_data._M_start._0_4_));
      std::vector<int,std::allocator<int>>::
      vector<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)&work,
                 (int *)(CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + (long)(int)uVar8 * 4),
                 (int *)(CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + (long)(int)top * 4),
                 (allocator_type *)&local_1f4);
      std::
      vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
      ::emplace_back<std::vector<int,std::allocator<int>>>
                ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                  *)&blocks,&work);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&work);
      top = uVar8;
    }
  }
  std::
  __reverse<__gnu_cxx::__normal_iterator<std::vector<int,std::allocator<int>>*,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>>
            (blocks.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             blocks.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&marked.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&stack.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work_1.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&C);
  sVar19 = (size_type)BT.nrow_;
  uVar18 = ((long)blocks.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start._0_4_
       = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&work_1,sVar19,(value_type_conflict2 *)&stack,(allocator_type *)&marked);
  uVar14 = 0;
  IVar10 = (Int)uVar18;
  uVar16 = 0;
  if (0 < IVar10) {
    uVar16 = uVar18 & 0xffffffff;
  }
  for (; uVar14 != uVar16; uVar14 = uVar14 + 1) {
    piVar5 = blocks.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar14].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    for (piVar13 = blocks.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar14].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start; piVar13 != piVar5; piVar13 = piVar13 + 1) {
      *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._0_4_) + (long)*piVar13 * 4) = (int)uVar14;
    }
  }
  SparseMatrix::SparseMatrix(&C,IVar10,0);
  marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&stack,sVar19,(value_type_conflict2 *)&marked,(allocator_type *)&work);
  for (uVar18 = 0; uVar18 != uVar16; uVar18 = uVar18 + 1) {
    piVar5 = blocks.
             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar18].
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ;
    for (piVar13 = blocks.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar18].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start; piVar13 != piVar5; piVar13 = piVar13 + 1) {
      iVar9 = *piVar13;
      piVar12 = BT.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar17 = (long)BT.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar9]; lVar17 < piVar12[(long)iVar9 + 1]
          ; lVar17 = lVar17 + 1) {
        iVar11 = *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._0_4_) +
                         (long)BT.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[lVar17] * 4);
        if (uVar18 != *(uint *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_start._4_4_,
                                         stack.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                         .super__Vector_impl_data._M_start._0_4_) + (long)iVar11 * 4
                               )) {
          *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_) + (long)iVar11 * 4) =
               (int)uVar18;
          SparseMatrix::push_back(&C,iVar11,1.0);
          piVar12 = BT.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        }
      }
    }
    SparseMatrix::add_column(&C);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&stack.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work_1.super__Vector_base<int,_std::allocator<int>_>);
  uVar18 = ((long)blocks.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)blocks.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  iVar9 = (int)uVar18;
  sVar19 = (size_type)iVar9;
  std::vector<int,_std::allocator<int>_>::vector(&stack,sVar19,(allocator_type *)&work_1);
  std::vector<int,_std::allocator<int>_>::vector(&marked,sVar19,(allocator_type *)&work_1);
  pIVar3 = local_1f0;
  std::vector<int,_std::allocator<int>_>::vector(&work,sVar19,(allocator_type *)&work_1);
  if (pIVar3 != (Int *)0x0) {
    local_1f4 = -1;
    std::vector<int,_std::allocator<int>_>::vector
              (&work_1,((long)(model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(model->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000
                       >> 0x20,&local_1f4,&local_259);
    piVar6 = C.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    piVar15 = C.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (piVar12 = (pointer)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_);
        piVar12 !=
        marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish; piVar12 = piVar12 + 1) {
      *piVar12 = -1;
    }
    uVar14 = 0;
    uVar16 = 0;
    if (0 < iVar9) {
      uVar16 = uVar18 & 0xffffffff;
    }
    for (; uVar14 != uVar16; uVar14 = uVar14 + 1) {
      IVar10 = DepthFirstSearch((Int)uVar14,piVar15,piVar6,(Int *)0x0,iVar9,
                                (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                stack.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_),
                                (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                marked.super__Vector_base<int,_std::allocator<int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_),
                                (Int)uVar14,
                                work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
      iVar11 = 0;
      for (lVar17 = (long)IVar10; lVar17 < iVar9; lVar17 = lVar17 + 1) {
        iVar2 = *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar17 * 4);
        iVar11 = iVar11 + (int)((ulong)((long)blocks.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish -
                                       (long)blocks.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start) >> 2);
      }
      piVar5 = blocks.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar13 = blocks.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar14].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar13 != piVar5; piVar13 = piVar13 + 1) {
        *(int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._4_4_,
                          work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start._0_4_) +
                (long)jmatch.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[*piVar13] * 4) = iVar11;
      }
    }
    piVar12 = (basis->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_start;
    uVar16 = 0;
    uVar14 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar14 = uVar16;
    }
    for (; uVar14 != uVar16; uVar16 = uVar16 + 1) {
      local_1f0[uVar16] =
           *(Int *)(CONCAT44(work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._4_4_,
                             work_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start._0_4_) + (long)piVar12[uVar16] * 4);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&work_1.super__Vector_base<int,_std::allocator<int>_>);
  }
  if (local_1e8 != (Int *)0x0) {
    Transpose((SparseMatrix *)&work_1,&C);
    SparseMatrix::operator=(&C,(SparseMatrix *)&work_1);
    SparseMatrix::~SparseMatrix((SparseMatrix *)&work_1);
    for (piVar12 = (pointer)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._4_4_,
                                     marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start._0_4_);
        piVar12 !=
        marked.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish; piVar12 = piVar12 + 1) {
      *piVar12 = -1;
    }
    uVar16 = 0;
    uVar14 = 0;
    if (0 < iVar9) {
      uVar14 = uVar18 & 0xffffffff;
    }
    for (; uVar16 != uVar14; uVar16 = uVar16 + 1) {
      IVar10 = DepthFirstSearch((Int)uVar16,
                                C.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                C.rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,(Int *)0x0,iVar9,
                                (Int *)CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                stack.super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start._0_4_),
                                (Int *)CONCAT44(marked.super__Vector_base<int,_std::allocator<int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                marked.super__Vector_base<int,_std::allocator<int>_>
                                                ._M_impl.super__Vector_impl_data._M_start._0_4_),
                                (Int)uVar16,
                                work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
      iVar11 = 0;
      for (lVar17 = (long)IVar10; lVar17 < iVar9; lVar17 = lVar17 + 1) {
        iVar2 = *(int *)(CONCAT44(stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar17 * 4);
        iVar11 = iVar11 + (int)((ulong)((long)blocks.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_finish -
                                       (long)blocks.
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start) >> 2);
      }
      piVar5 = blocks.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      for (piVar13 = blocks.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16].
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start; piVar13 != piVar5; piVar13 = piVar13 + 1) {
        local_1e8[*piVar13] = iVar11;
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&work.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&marked.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&stack.super__Vector_base<int,_std::allocator<int>_>);
  SparseMatrix::~SparseMatrix(&C);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&blocks);
  SparseMatrix::~SparseMatrix(&BT);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&jmatch.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void SymbolicInvert(const Model& model, const std::vector<Int>& basis,
                    Int* rowcounts, Int* colcounts) {
    const SparseMatrix& AI = model.AI();
    const Int m = AI.rows();
    assert((Int)basis.size() == m);

    // jmatch is a permutation of basis such that B = AI[:,jmatch] has a
    // zero-free diagonal.
    std::vector<Int> jmatch = Matching(model, RandomPermute(basis));
    SparseMatrix BT = CopyColumns(AI, jmatch);
    BT = Transpose(BT);

    std::vector<std::vector<Int> > blocks = Blockperm(AI, jmatch, BT);
    SparseMatrix C = CoarsenedGraph(BT, blocks);

    const Int nb = blocks.size();
    std::vector<Int> stack(nb), marked(nb), work(nb);

    if (rowcounts) {
        std::vector<Int> jcount(AI.cols(), -1);
        std::fill(marked.begin(), marked.end(), -1);
        const Int* Cp = C.colptr();
        const Int* Ci = C.rowidx();
        for (Int b = 0; b < nb; b++) {
            Int top = DepthFirstSearch(b, Cp, Ci, nullptr, nb, stack.data(),
                                       marked.data(), b, work.data());
            Int nz = 0;
            for (Int t = top; t < nb; t++)
                nz += blocks[stack[t]].size();
            for (Int i : blocks[b])
                jcount[jmatch[i]] = nz;
        }
        for (Int p = 0; p < m; p++) {
            rowcounts[p] = jcount[basis[p]];
            assert(rowcounts[p] >= 0);
        }
    }

    if (colcounts) {
        C = Transpose(C);
        std::fill(marked.begin(), marked.end(), -1);
        const Int* Cp = C.colptr();
        const Int* Ci = C.rowidx();
        for (Int b = 0; b < nb; b++) {
            Int top = DepthFirstSearch(b, Cp, Ci, nullptr, nb, stack.data(),
                                       marked.data(), b, work.data());
            Int nz = 0;
            for (Int t = top; t < nb; t++)
                nz += blocks[stack[t]].size();
            for (Int i : blocks[b])
                colcounts[i] = nz;
        }
    }
}